

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::addToolBarBreak(QMainWindowLayout *this,ToolBarArea area)

{
  DockPosition pos;
  ToolBarArea area_00;
  
  if (area - LeftToolBarArea < 8) {
    area_00 = *(ToolBarArea *)(&DAT_0065eec0 + (ulong)(area - LeftToolBarArea) * 4);
  }
  else {
    area_00 = TopToolBarArea;
  }
  pos = toDockPos(area_00);
  QToolBarAreaLayout::addToolBarBreak((QToolBarAreaLayout *)(this + 0xa0),pos);
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    QToolBarAreaLayout::addToolBarBreak((QToolBarAreaLayout *)(this + 0x3d8),pos);
  }
  (**(code **)(*(long *)this + 0x70))(this);
  return;
}

Assistant:

void QMainWindowLayout::addToolBarBreak(Qt::ToolBarArea area)
{
    area = validateToolBarArea(area);

    layoutState.toolBarAreaLayout.addToolBarBreak(toDockPos(area));
    if (savedState.isValid())
        savedState.toolBarAreaLayout.addToolBarBreak(toDockPos(area));

    invalidate();
}